

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

void __thiscall QTabBar::setTabsClosable(QTabBar *this,bool closable)

{
  QTabBarPrivate *this_00;
  Tab **ppTVar1;
  long lVar2;
  long lVar3;
  ButtonPosition position;
  QStyle *pQVar4;
  QWidget *pQVar5;
  long lVar6;
  bool bVar7;
  undefined8 *puVar8;
  int i;
  ulong uVar9;
  long in_FS_OFFSET;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if (((*(ushort *)&this_00->field_0x2d0 & 0x40) == 0) == closable) {
    *(ushort *)&this_00->field_0x2d0 =
         *(ushort *)&this_00->field_0x2d0 & 0xffbf | (ushort)closable << 6;
    pQVar4 = QWidget::style(&this->super_QWidget);
    position = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x5c,0,this,0);
    if (closable) {
      bVar7 = false;
      for (uVar9 = 0; uVar9 < (ulong)(this_00->tabList).d.size; uVar9 = uVar9 + 1) {
        pQVar5 = tabButton(this,(int)uVar9,position);
        if (pQVar5 == (QWidget *)0x0) {
          pQVar5 = (QWidget *)operator_new(0x28);
          anon_unknown.dwarf_fc801a::CloseButton::CloseButton
                    ((CloseButton *)pQVar5,&this->super_QWidget);
          QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QTabBarPrivate::*)()>
                    ((Object *)&stack0xffffffffffffffc0,(offset_in_QAbstractButton_to_subr)pQVar5,
                     (Object *)QAbstractButton::clicked,0,(ConnectionType)this_00);
          QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc0);
          setTabButton(this,(int)uVar9,position,pQVar5);
          bVar7 = true;
        }
      }
      if (bVar7) {
        QTabBarPrivate::layoutTabs(this_00);
      }
    }
    else {
      ppTVar1 = (this_00->tabList).d.ptr;
      lVar2 = (this_00->tabList).d.size;
      for (lVar6 = 0; lVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
        lVar3 = *(long *)((long)ppTVar1 + lVar6);
        if (position == RightSide) {
          if (*(long *)(lVar3 + 0xd0) != 0) {
            puVar8 = (undefined8 *)(lVar3 + 0xd0);
            goto LAB_00452966;
          }
        }
        else if ((position == LeftSide) && (*(long *)(lVar3 + 200) != 0)) {
          puVar8 = (undefined8 *)(lVar3 + 200);
LAB_00452966:
          QObject::deleteLater();
          *puVar8 = 0;
        }
      }
    }
    QWidget::update(&this->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBar::setTabsClosable(bool closable)
{
    Q_D(QTabBar);
    if (d->closeButtonOnTabs == closable)
        return;
    d->closeButtonOnTabs = closable;
    ButtonPosition closeSide = (ButtonPosition)style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, this);
    if (!closable) {
        for (auto tab : std::as_const(d->tabList)) {
            if (closeSide == LeftSide && tab->leftWidget) {
                tab->leftWidget->deleteLater();
                tab->leftWidget = nullptr;
            }
            if (closeSide == RightSide && tab->rightWidget) {
                tab->rightWidget->deleteLater();
                tab->rightWidget = nullptr;
            }
        }
    } else {
        bool newButtons = false;
        for (int i = 0; i < d->tabList.size(); ++i) {
            if (tabButton(i, closeSide))
                continue;
            newButtons = true;
            QAbstractButton *closeButton = new CloseButton(this);
            QObjectPrivate::connect(closeButton, &CloseButton::clicked,
                                    d, &QTabBarPrivate::closeTab);
            setTabButton(i, closeSide, closeButton);
        }
        if (newButtons)
            d->layoutTabs();
    }
    update();
}